

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAig.c
# Opt level: O0

Gia_Man_t * Gia_ManFromAigSwitch(Aig_Man_t *p)

{
  int iVar1;
  Gia_Man_t *p_00;
  char *pcVar2;
  Aig_Obj_t *pAVar3;
  void *pvVar4;
  int local_24;
  int i;
  Aig_Obj_t *pObj;
  Gia_Man_t *pNew;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManObjNum(p);
  p_00 = Gia_ManStart(iVar1);
  pcVar2 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar2;
  pcVar2 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar2;
  p_00->nConstrs = p->nConstrs;
  Aig_ManCleanData(p);
  pAVar3 = Aig_ManConst1(p);
  (pAVar3->field_5).iData = 1;
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->vCis), local_24 < iVar1; local_24 = local_24 + 1) {
    pvVar4 = Vec_PtrEntry(p->vCis,local_24);
    iVar1 = Gia_ManAppendCi(p_00);
    *(int *)((long)pvVar4 + 0x28) = iVar1;
  }
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->vObjs), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_24);
    if (((pAVar3 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar3), iVar1 != 0)) &&
       (iVar1 = Aig_ObjRefs(pAVar3), iVar1 == 0)) {
      Gia_ManFromAig_rec(p_00,p,pAVar3);
      Gia_ManAppendCo(p_00,(pAVar3->field_5).iData);
    }
  }
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->vCos), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_24);
    pAVar3 = Aig_ObjFanin0(pAVar3);
    Gia_ManFromAig_rec(p_00,p,pAVar3);
  }
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->vCos), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_24);
    iVar1 = Gia_ObjChild0Copy(pAVar3);
    iVar1 = Gia_ManAppendCo(p_00,iVar1);
    (pAVar3->field_5).iData = iVar1;
  }
  iVar1 = Aig_ManRegNum(p);
  Gia_ManSetRegNum(p_00,iVar1);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManFromAigSwitch( Aig_Man_t * p )
{
    Gia_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    // create the new manager
    pNew = Gia_ManStart( Aig_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nConstrs = p->nConstrs;
    // create the PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->iData = 1;
    Aig_ManForEachCi( p, pObj, i )
        pObj->iData = Gia_ManAppendCi( pNew );
    // add POs corresponding to the nodes with choices
    Aig_ManForEachNode( p, pObj, i )
        if ( Aig_ObjRefs(pObj) == 0 )
        {
            Gia_ManFromAig_rec( pNew, p, pObj );        
            Gia_ManAppendCo( pNew, pObj->iData );
        }
    // add logic for the POs
    Aig_ManForEachCo( p, pObj, i )
        Gia_ManFromAig_rec( pNew, p, Aig_ObjFanin0(pObj) );        
    Aig_ManForEachCo( p, pObj, i )
        pObj->iData = Gia_ManAppendCo( pNew, Gia_ObjChild0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    return pNew;
}